

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
wasm::anon_unknown_0::MinimizeRecGroups::getCanonicalPermutation
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MinimizeRecGroups *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer *__k;
  size_t *psVar1;
  __node_base_ptr *__x;
  long *plVar2;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __first;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __last;
  pointer pHVar3;
  long lVar4;
  size_type sVar5;
  mapped_type *this_00;
  ulong uVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  mapped_type *__x_00;
  pointer pvVar9;
  size_type __n;
  uint uVar10;
  long *plVar11;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __i;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __last_00;
  pointer *ppHVar12;
  pointer pHVar13;
  __ireturn_type _Var14;
  undefined1 local_1a8 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  typeSet;
  reverse_iterator<__gnu_cxx::__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  local_150;
  reverse_iterator<__gnu_cxx::__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  local_148;
  long local_140;
  ulong local_138;
  undefined1 local_130 [8];
  map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  typeClasses;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  indexInLeastOrder;
  HeapType type;
  undefined1 auStack_b8 [8];
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  indexInFinalOrder;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  dfsOrders;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> finalOrder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *permutation;
  
  uVar10 = 0;
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_1a8,
             (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish,0,
             &typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,auStack_b8,local_130);
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
            *)&indexInFinalOrder._M_h._M_single_bucket,
           (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3,
           (allocator_type *)&typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  psVar1 = &typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __k = &dfsOrders.
         super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while( true ) {
    uVar6 = (ulong)uVar10;
    __n = (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                .super__Vector_impl_data._M_start >> 3;
    if (__n <= uVar6) {
      typeClasses._M_t._M_impl._0_4_ = 0;
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      __x = &typeSet._M_h._M_single_bucket;
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Rb_tree_node_base *)&typeClasses;
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Rb_tree_node_base *)&typeClasses;
      for (pvVar9 = (pointer)indexInFinalOrder._M_h._M_single_bucket;
          pvVar9 != dfsOrders.
                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar9 = pvVar9 + 1) {
        typeSet._M_h._M_single_bucket = (__node_base_ptr)this;
        typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pvVar9;
        std::function<bool_(wasm::HeapType,_wasm::HeapType)>::function
                  ((function<bool_(wasm::HeapType,_wasm::HeapType)> *)&indexInLeastOrder,
                   (function<bool_(wasm::HeapType,_wasm::HeapType)> *)__x);
        std::_Function_base::~_Function_base((_Function_base *)__x);
        this_00 = std::
                  map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                  ::operator[]((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                                *)local_130,
                               (key_type *)
                               &typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (this_00,(value_type *)
                           (pvVar9->
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                           _M_impl.super__Vector_impl_data._M_start);
        std::_Function_base::~_Function_base((_Function_base *)&indexInLeastOrder);
      }
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&indexInLeastOrder._M_h._M_rehash_policy._M_next_resize;
      indexInLeastOrder._M_h._M_buckets = (__buckets_ptr)0x1;
      indexInLeastOrder._M_h._M_bucket_count = 0;
      indexInLeastOrder._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      indexInLeastOrder._M_h._M_element_count._0_4_ = 0x3f800000;
      indexInLeastOrder._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      indexInLeastOrder._M_h._M_rehash_policy._4_4_ = 0;
      indexInLeastOrder._M_h._M_rehash_policy._M_next_resize = 0;
      plVar2 = (long *)(*(undefined8 **)
                         (typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1))
                       [1];
      for (plVar11 = (long *)**(undefined8 **)
                               (typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                               1); plVar11 != plVar2; plVar11 = plVar11 + 1) {
        auStack_b8 = (undefined1  [8])*plVar11;
        indexInFinalOrder._M_h._M_buckets =
             (__buckets_ptr)
             CONCAT44(indexInFinalOrder._M_h._M_buckets._4_4_,
                      indexInLeastOrder._M_h._M_before_begin._M_nxt._0_4_);
        std::
        _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                  ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,auStack_b8);
      }
      local_140 = (long)typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[2].
                        _M_left -
                  (long)typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[2].
                        _M_parent;
      uVar6 = local_140 >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_138 = (ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e;
      psVar1 = &typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count;
      p_Var7 = typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      while( true ) {
        if (p_Var7 == (_Rb_tree_node_base *)&typeClasses) {
          dfsOrders.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &dfsOrders.
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (long)(types->
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(types->
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
          for (uVar10 = 0;
              p_Var8 = typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
              uVar10 < uVar6; uVar10 = uVar10 + 1) {
            for (; p_Var8 != (_Rb_tree_node_base *)&typeClasses;
                p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &dfsOrders.
                          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (value_type *)(&(p_Var8[2]._M_parent)->_M_color + (ulong)uVar10 * 2));
            }
          }
          auStack_b8 = (undefined1  [8])&indexInFinalOrder._M_h._M_rehash_policy._M_next_resize;
          indexInFinalOrder._M_h._M_buckets = (__buckets_ptr)0x1;
          indexInFinalOrder._M_h._M_bucket_count = 0;
          indexInFinalOrder._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          indexInFinalOrder._M_h._M_element_count._0_4_ = 0x3f800000;
          indexInFinalOrder._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          indexInFinalOrder._M_h._M_rehash_policy._4_4_ = 0;
          indexInFinalOrder._M_h._M_rehash_policy._M_next_resize = 0;
          for (ppHVar12 = (pointer *)
                          dfsOrders.
                          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (pointer)ppHVar12 != (pointer)0x0; ppHVar12 = ppHVar12 + 1) {
            indexInLeastOrder._M_h._M_single_bucket = (__node_base_ptr)*ppHVar12;
            std::
            _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                      ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)auStack_b8,&indexInLeastOrder._M_h._M_single_bucket);
          }
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                    (__return_storage_ptr__,
                     (long)(types->
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(types->
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
          pHVar3 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pHVar13 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                         )._M_impl.super__Vector_impl_data._M_start; pHVar13 != pHVar3;
              pHVar13 = pHVar13 + 1) {
            indexInLeastOrder._M_h._M_single_bucket = (__node_base_ptr)pHVar13->id;
            __x_00 = std::__detail::
                     _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)auStack_b8,(key_type *)&indexInLeastOrder._M_h._M_single_bucket);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (__return_storage_ptr__,__x_00);
          }
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)auStack_b8);
          std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                    ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &dfsOrders.
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<wasm::ComparableRecGroupShape,_std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<wasm::ComparableRecGroupShape,_std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                       *)local_130);
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&indexInFinalOrder._M_h._M_single_bucket);
          std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_1a8);
          return __return_storage_ptr__;
        }
        __first._M_current = (HeapType *)p_Var7[2]._M_parent;
        __last._M_current = (HeapType *)p_Var7[2]._M_left;
        if ((long)__last._M_current - (long)__first._M_current != local_140) break;
        if (__first._M_current != __last._M_current) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                    (__first,__last,local_138,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                      )psVar1);
          if ((long)__last._M_current - (long)__first._M_current < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                      (__first,__last,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                        )psVar1);
          }
          else {
            __last_00._M_current = __first._M_current + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                      (__first,__last_00,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                        )psVar1);
            for (; __last_00._M_current != __last._M_current;
                __last_00._M_current = __last_00._M_current + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,__gnu_cxx::__ops::_Val_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                        (__last_00,
                         (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                          )psVar1);
            }
          }
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      }
      __assert_fail("members.size() == classSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                    ,0x313,
                    "std::vector<Index> wasm::(anonymous namespace)::MinimizeRecGroups::getCanonicalPermutation(const std::vector<HeapType> &)"
                   );
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               (indexInFinalOrder._M_h._M_single_bucket + uVar6 * 3),__n);
    indexInFinalOrder._M_h._M_bucket_count = 0;
    auStack_b8 = (undefined1  [8])0x0;
    indexInFinalOrder._M_h._M_buckets = (__buckets_ptr)0x0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_b8,
               (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar6);
    typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&indexInLeastOrder._M_h._M_rehash_policy._M_next_resize;
    indexInLeastOrder._M_h._M_buckets = (__buckets_ptr)0x1;
    indexInLeastOrder._M_h._M_bucket_count = 0;
    indexInLeastOrder._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    indexInLeastOrder._M_h._M_element_count._0_4_ = 0x3f800000;
    indexInLeastOrder._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    indexInLeastOrder._M_h._M_rehash_policy._4_4_ = 0;
    indexInLeastOrder._M_h._M_rehash_policy._M_next_resize = 0;
    while (auStack_b8 != (undefined1  [8])indexInFinalOrder._M_h._M_buckets) {
      dfsOrders.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)indexInFinalOrder._M_h._M_buckets[-1];
      indexInFinalOrder._M_h._M_buckets = indexInFinalOrder._M_h._M_buckets + -1;
      sVar5 = std::
              _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_1a8,(key_type *)__k);
      if ((sVar5 != 0) &&
         (_Var14 = std::__detail::
                   _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)psVar1,(value_type *)__k),
         ((undefined1  [16])_Var14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   (indexInFinalOrder._M_h._M_single_bucket + uVar6 * 3),(value_type *)__k);
        HeapType::getReferencedHeapTypes
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_130,
                   (HeapType *)__k);
        local_148.current._M_current =
             (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
              )(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                )local_130;
        std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
        insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>,void>
                  ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)auStack_b8,
                   (const_iterator)indexInFinalOrder._M_h._M_buckets,&local_150,&local_148);
        std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                  ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_130);
      }
    }
    if ((long)indexInFinalOrder._M_h._M_single_bucket[uVar6 * 3 + 1]._M_nxt -
        (long)indexInFinalOrder._M_h._M_single_bucket[uVar6 * 3]._M_nxt !=
        (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_start) break;
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)psVar1);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_b8);
    uVar10 = uVar10 + 1;
  }
  __assert_fail("dfsOrders[i].size() == types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                ,0x2ee,
                "std::vector<Index> wasm::(anonymous namespace)::MinimizeRecGroups::getCanonicalPermutation(const std::vector<HeapType> &)"
               );
}

Assistant:

std::vector<Index>
  getCanonicalPermutation(const std::vector<HeapType>& types) {
    // The correctness of this part depends on some interesting properties of
    // strongly connected graphs with ordered, directed edges. A permutation of
    // the vertices in a graph is an isomorphism that produces an isomorphic
    // graph. An automorphism is an isomorphism of a structure onto itself, so
    // an automorphism of a graph is a permutation of the vertices that does not
    // change the label-independent properties of a graph. Permutations can be
    // described in terms of sets of cycles of elements.
    //
    // As an example, consider this strongly-connected recursion group:
    //
    //     (rec
    //       (type $a1 (struct (field (ref $a2) (ref $b1))))
    //       (type $a2 (struct (field (ref $a1) (ref $b2))))
    //       (type $b1 (struct (field (ref $b2) (ref $a1))))
    //       (type $b2 (struct (field (ref $b1) (ref $a2))))
    //     )
    //
    // This group has one nontrivial automorphism: ($a1 $a2) ($b1 $b2). Applying
    // this automorphism gives this recursion group:
    //
    //     (rec
    //       (type $a2 (struct (field (ref $a1) (ref $b2))))
    //       (type $a1 (struct (field (ref $a2) (ref $b1))))
    //       (type $b2 (struct (field (ref $b1) (ref $a2))))
    //       (type $b1 (struct (field (ref $b2) (ref $a1))))
    //     )
    //
    // We can verify that the permutation was an automorphism by checking that
    // the label-independent properties of these two rec groups are the same.
    // Indeed, when we write the adjacency matrices with ordered edges for the
    // two graphs, they both come out to this:
    //
    //     0: _ 0 1 _
    //     1: 0 _ _ 1
    //     2: 1 _ _ 0
    //     3: _ 1 0 _
    //
    // In addition to having the same adjacency matrix, the two recursion groups
    // have the same vertex colorings since all of their types have the same
    // top-level structure. Since the label-independent properties of the
    // recursion groups (i.e. all the properties except the intended type
    // identity at each index) are the same, the permutation that takes one
    // group to the other is an automorphism. These are precisely the
    // permutations that do not change a recursion group's shape, so would not
    // change type identity under WebAssembly's isorecursive type system. In
    // other words, automorphisms cannot help us resolve shape conflicts, so we
    // want to avoid generating them.
    //
    // Theorem 1: All cycles in an automorphism of a strongly-connected
    // recursion group are the same size.
    //
    //     Proof: By contradiction. Assume there are two cycles of different
    //     sizes. Because the group is strongly connected, there is a path from
    //     an element in the smaller of these cycles to an element in the
    //     larger. This path must contain an edge between two vertices in cycles
    //     of different sizes N and M such that N < M. Apply the automorphism N
    //     times. The source of this edge has been cycled back to its original
    //     index, but the destination is not yet back at its original index, so
    //     the edge's destination index is different from its original
    //     destination index and the permutation we applied was not an
    //     automorphism after all.
    //
    // Corollary 1.1: No nontrivial automorphism of an SCC may have a stationary
    // element, since either all the cycles have size 1 and the automorphism is
    // trivial or all the cycles have some other size and there are no
    // stationary elements.
    //
    // Corollary 1.2: No two distinct permutations of an SCC with the same first
    // element (e.g. both with some type $t as the first element) have the same
    // shape, since no nontrivial automorphism can keep the first element
    // stationary while mapping one permutation to the other.
    //
    // Find a canonical ordering of the types in this group. The ordering must
    // be independent of the initial order of the types. To do so, consider the
    // orderings given by visitation order on a tree search rooted at each type
    // in the group. Since the group is strongly connected, a tree search from
    // any of types will visit all types in the group, so it will generate a
    // total and deterministic ordering of the types in the group. We can
    // compare the shapes of each of these orderings to organize the root
    // types and their generated orderings into ordered equivalence classes.
    // These equivalence classes each correspond to a cycle in an automorphism
    // of the graph because their elements are vertices that can all occupy the
    // initial index of the graph without the graph structure changing. We can
    // choose an arbitrary ordering from the least equivalence class as a
    // canonical ordering because all orderings in that class describe the same
    // label-independent graph.
    //
    // Compute the orderings generated by DFS on each type.
    std::unordered_set<HeapType> typeSet(types.begin(), types.end());
    std::vector<std::vector<HeapType>> dfsOrders(types.size());
    for (Index i = 0; i < types.size(); ++i) {
      dfsOrders[i].reserve(types.size());
      std::vector<HeapType> workList;
      workList.push_back(types[i]);
      std::unordered_set<HeapType> seen;
      while (!workList.empty()) {
        auto curr = workList.back();
        workList.pop_back();
        if (!typeSet.count(curr)) {
          continue;
        }
        if (seen.insert(curr).second) {
          dfsOrders[i].push_back(curr);
          auto children = curr.getReferencedHeapTypes();
          workList.insert(workList.end(), children.rbegin(), children.rend());
        }
      }
      assert(dfsOrders[i].size() == types.size());
    }

    // Organize the orderings into equivalence classes, mapping equivalent
    // shapes to lists of automorphically equivalent root types.
    std::map<ComparableRecGroupShape, std::vector<HeapType>> typeClasses;
    for (const auto& order : dfsOrders) {
      ComparableRecGroupShape shape(order, [this](HeapType a, HeapType b) {
        return this->typeIndices.at(a) < this->typeIndices.at(b);
      });
      typeClasses[shape].push_back(order[0]);
    }

    // Choose the initial canonical ordering.
    const auto& leastOrder = typeClasses.begin()->first.types;

    // We want our canonical ordering to have the additional property that it
    // contains one type from each equivalence class before a second type of any
    // equivalence class. Since our utility for enumerating the topological
    // sorts of the canonical order keeps the initial element fixed as long as
    // possible before moving to the next one, by Corollary 1.2 and because
    // permutations that begin with types in different equivalence class cannot
    // have the same shape (otherwise those initial types would be in the same
    // equivalence class), this will maximize the number of distinct shapes the
    // utility emits before starting to emit permutations that have the same
    // shapes as previous permutations. Since all the type equivalence classes
    // are the same size by Theorem 1, we can assemble the final order by
    // striping across the equivalence classes. We determine the order of types
    // taken from each equivalence class by sorting them by order of appearance
    // in the least order, which ensures the final order remains independent of
    // the initial order.
    std::unordered_map<HeapType, Index> indexInLeastOrder;
    for (auto type : leastOrder) {
      indexInLeastOrder.insert({type, indexInLeastOrder.size()});
    }
    auto classSize = typeClasses.begin()->second.size();
    for (auto& [shape, members] : typeClasses) {
      assert(members.size() == classSize);
      std::sort(members.begin(), members.end(), [&](HeapType a, HeapType b) {
        return indexInLeastOrder.at(a) < indexInLeastOrder.at(b);
      });
    }
    std::vector<HeapType> finalOrder;
    finalOrder.reserve(types.size());
    for (Index i = 0; i < classSize; ++i) {
      for (auto& [shape, members] : typeClasses) {
        finalOrder.push_back(members[i]);
      }
    }

    // Now what we actually want is the permutation that takes us from the final
    // canonical order to the original order of the types.
    std::unordered_map<HeapType, Index> indexInFinalOrder;
    for (auto type : finalOrder) {
      indexInFinalOrder.insert({type, indexInFinalOrder.size()});
    }
    std::vector<Index> permutation;
    permutation.reserve(types.size());
    for (auto type : types) {
      permutation.push_back(indexInFinalOrder.at(type));
    }
    return permutation;
  }